

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  double dVar5;
  
  uVar2 = (uint)pMem->flags;
  if ((pMem->flags & 0xd) == 0) {
    iVar1 = sqlite3Atoi64(pMem->z,(i64 *)pMem,pMem->n,pMem->enc);
    if (iVar1 == 0) {
      uVar3 = pMem->flags & 0x3e00;
    }
    else {
      dVar5 = sqlite3VdbeRealValue(pMem);
      (pMem->u).r = dVar5;
      uVar3 = pMem->flags & 0x3e00;
      uVar2 = uVar3 + 8;
      if ((9.223372036854776e+18 <= ABS(dVar5)) ||
         (lVar4 = (long)dVar5,
         0xfffffffffffffffd < lVar4 + 0x7fffffffffffffffU || dVar5 != (double)lVar4))
      goto LAB_00137fd6;
      (pMem->u).i = lVar4;
    }
    uVar2 = uVar3 | 4;
  }
LAB_00137fd6:
  pMem->flags = (u16)(uVar2 & 0xbfed);
  return uVar2 & 0xbfed;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))==0 ){
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    if( 0==sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc) ){
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      pMem->u.r = sqlite3VdbeRealValue(pMem);
      MemSetTypeFlag(pMem, MEM_Real);
      sqlite3VdbeIntegerAffinity(pMem);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob|MEM_Zero);
  return SQLITE_OK;
}